

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hdr_histogram.c
# Opt level: O0

int64_t hdr_size_of_equivalent_value_range(hdr_histogram *h,int64_t value)

{
  int32_t iVar1;
  int32_t local_28;
  int32_t adjusted_bucket;
  int32_t sub_bucket_index;
  int32_t bucket_index;
  int64_t value_local;
  hdr_histogram *h_local;
  
  local_28 = get_bucket_index(h,value);
  iVar1 = get_sub_bucket_index(value,local_28,h->unit_magnitude);
  if (h->sub_bucket_count <= iVar1) {
    local_28 = local_28 + 1;
  }
  return 1L << ((char)h->unit_magnitude + (char)local_28 & 0x3fU);
}

Assistant:

int64_t hdr_size_of_equivalent_value_range(const struct hdr_histogram* h, int64_t value)
{
    int32_t bucket_index     = get_bucket_index(h, value);
    int32_t sub_bucket_index = get_sub_bucket_index(value, bucket_index, h->unit_magnitude);
    int32_t adjusted_bucket  = (sub_bucket_index >= h->sub_bucket_count) ? (bucket_index + 1) : bucket_index;
    return INT64_C(1) << (h->unit_magnitude + adjusted_bucket);
}